

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_bauth.c
# Opt level: O3

size_t btokBAuthT_keep(size_t l)

{
  size_t sVar1;
  
  sVar1 = bignStart_keep(l,btokBAuthT_deep);
  return sVar1 + (l * 2 + 7 >> 4) + (l * 2 + 0x3f >> 3 & 0xfffffffffffffff8) * 3 + 0x238;
}

Assistant:

size_t btokBAuthT_keep(size_t l)
{
	const size_t n = W_OF_B(2 * l);
	const size_t no = O_OF_B(2 * l);
	return sizeof(bake_bauth_t_o) +
		bignStart_keep(l, btokBAuthT_deep) +
		3 * O_OF_W(n) + no / 2;
}